

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall cmComputeLinkDepends::~cmComputeLinkDepends(cmComputeLinkDepends *this)

{
  pointer piVar1;
  pointer pcVar2;
  pointer ppDVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  std::
  for_each<__gnu_cxx::__normal_iterator<cmComputeLinkDepends::DependSetList*const*,std::vector<cmComputeLinkDepends::DependSetList*,std::allocator<cmComputeLinkDepends::DependSetList*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmComputeLinkDepends::DependSetList*,std::allocator<cmComputeLinkDepends::DependSetList*>>,false>>
            ((this->InferredDependSets).
             super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->InferredDependSets).
             super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&(this->OldWrongConfigItems)._M_t);
  piVar1 = (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->OriginalEntries).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  piVar1 = (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->FinalLinkOrder).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  ~unique_ptr(&this->CCG);
  std::
  _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::PendingComponent>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
  ::~_Rb_tree(&(this->PendingComponents)._M_t);
  piVar1 = (this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->ComponentOrder).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  pcVar2 = (this->ComponentVisited).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2,(long)(this->ComponentVisited).
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar2);
  }
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::~vector
            (&(this->EntryConstraintGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  ppDVar3 = (this->InferredDependSets).
            super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppDVar3 != (pointer)0x0) {
    operator_delete(ppDVar3,(long)(this->InferredDependSets).
                                  super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppDVar3
                   );
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->SharedDepFollowed)._M_t);
  std::
  deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
  ::~deque(&(this->SharedDepQueue).c);
  std::_Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
  ::~_Deque_base((_Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                  *)&this->BFSQueue);
  std::
  _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_int>,_std::_Select1st<std::pair<const_cmLinkItem,_int>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_int>_>_>
  ::~_Rb_tree(&(this->LinkEntryIndex)._M_t);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  ~vector(&this->EntryList);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  ~vector(&this->FinalLinkEntries);
  pcVar4 = (this->Config)._M_dataplus._M_p;
  paVar5 = &(this->Config).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmComputeLinkDepends::~cmComputeLinkDepends()
{
  cmDeleteAll(this->InferredDependSets);
}